

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

unordered_map<kratos::StmtBlock_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::StmtBlock_*>,_std::equal_to<kratos::StmtBlock_*>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::SystemVerilogCodeGen::index_named_block_abi_cxx11_
          (unordered_map<kratos::StmtBlock_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::StmtBlock_*>,_std::equal_to<kratos::StmtBlock_*>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,SystemVerilogCodeGen *this)

{
  __hashtable *__this;
  long *plVar1;
  double dVar2;
  undefined1 local_80 [8];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  __node_base_ptr local_40;
  pointer local_38;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  Generator::named_blocks_labels_abi_cxx11_
            ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_80,this->generator_);
  dVar2 = ceil((((double)CONCAT44(0x45300000,(int)((ulong)names._M_h._M_before_begin._M_nxt >> 0x20)
                                 ) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)names._M_h._M_before_begin._M_nxt) -
               4503599627370496.0)) /
               (double)(__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor);
  std::
  _Hashtable<kratos::StmtBlock_*,_std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::StmtBlock_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::StmtBlock_*>,_std::hash<kratos::StmtBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&__return_storage_ptr__->_M_h,
           (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2);
  if (names._M_h._M_bucket_count != 0) {
    plVar1 = (long *)names._M_h._M_bucket_count;
    do {
      Generator::get_named_block((Generator *)&stack0xffffffffffffffc0,(string *)this->generator_);
      names._M_h._M_single_bucket = local_40;
      std::
      _Hashtable<kratos::StmtBlock*,std::pair<kratos::StmtBlock*const,std::__cxx11::string>,std::allocator<std::pair<kratos::StmtBlock*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<kratos::StmtBlock*>,std::hash<kratos::StmtBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<kratos::StmtBlock*,std::__cxx11::string_const&>
                ((_Hashtable<kratos::StmtBlock*,std::pair<kratos::StmtBlock*const,std::__cxx11::string>,std::allocator<std::pair<kratos::StmtBlock*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<kratos::StmtBlock*>,std::hash<kratos::StmtBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)__return_storage_ptr__,&names._M_h._M_single_bucket,plVar1 + 1);
      if (local_38 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
      }
      plVar1 = (long *)*plVar1;
    } while (plVar1 != (long *)0x0);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_80);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<StmtBlock*, std::string> SystemVerilogCodeGen::index_named_block() {
    std::unordered_map<StmtBlock*, std::string> result;
    auto names = generator_->named_blocks_labels();
    result.reserve(names.size());
    for (auto const& name : names) {
        result.emplace(generator_->get_named_block(name).get(), name);
    }
    return result;
}